

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O0

bool __thiscall DnsStats::IsRegisteredTLD(DnsStats *this,uint8_t *tld,size_t tld_length)

{
  byte bVar1;
  uint32_t uVar2;
  TldAsKey *pTVar3;
  undefined1 local_98 [8];
  TldAsKey key;
  bool isRegistered;
  size_t tld_length_local;
  uint8_t *tld_local;
  DnsStats *this_local;
  
  key.hash._3_1_ = 0;
  TldAsKey::TldAsKey((TldAsKey *)local_98,tld,tld_length);
  uVar2 = BinHash<TldAsKey>::GetCount(&this->registeredTld);
  if (uVar2 == 0) {
    LoadRegisteredTLD_from_memory(this);
  }
  pTVar3 = BinHash<TldAsKey>::Retrieve(&this->registeredTld,(TldAsKey *)local_98);
  if (pTVar3 != (TldAsKey *)0x0) {
    key.hash._3_1_ = 1;
  }
  bVar1 = key.hash._3_1_;
  TldAsKey::~TldAsKey((TldAsKey *)local_98);
  return (bool)(bVar1 & 1);
}

Assistant:

bool DnsStats::IsRegisteredTLD(uint8_t* tld, size_t tld_length)
{

    bool isRegistered = false;
    TldAsKey key(tld, tld_length);

    if (registeredTld.GetCount() == 0)
    {
        this->LoadRegisteredTLD_from_memory();
    }

    if (registeredTld.Retrieve(&key) != NULL)
    {
        isRegistered = true;
    }

    return isRegistered;
}